

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O0

void __thiscall TripleBuffer<stStateCore>::~TripleBuffer(TripleBuffer<stStateCore> *this)

{
  stStateCore *in_RDI;
  
  stStateCore::~stStateCore(in_RDI);
  stStateCore::~stStateCore(in_RDI);
  stStateCore::~stStateCore(in_RDI);
  return;
}

Assistant:

bool update(bool force = false) {
        std::lock_guard<std::mutex> lock(mutex);
        hasChanged = true || force;
        this->flags.clear();

        return true;
    }